

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_ticket_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  uint32_t uVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((hs->field_0x6ca & 1) != 0) {
    uVar1 = SSL_get_options(hs->ssl);
    if ((uVar1 >> 0xe & 1) != 0) {
      __assert_fail("(SSL_get_options(hs->ssl) & SSL_OP_NO_TICKET) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x3d0,"bool bssl::ext_ticket_add_serverhello(SSL_HANDSHAKE *, CBB *)");
    }
    iVar2 = CBB_add_u16(out,0x23);
    if (iVar2 == 0) {
      bVar3 = false;
    }
    else {
      iVar2 = CBB_add_u16(out,0);
      bVar3 = iVar2 != 0;
    }
  }
  return bVar3;
}

Assistant:

static bool ext_ticket_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (!hs->ticket_expected) {
    return true;
  }

  // If |SSL_OP_NO_TICKET| is set, |ticket_expected| should never be true.
  assert((SSL_get_options(hs->ssl) & SSL_OP_NO_TICKET) == 0);

  if (!CBB_add_u16(out, TLSEXT_TYPE_session_ticket) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}